

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkHeader.cpp
# Opt level: O2

void __thiscall ShellLinkHeader::parseFileAttributesFlags(ShellLinkHeader *this,uint flags)

{
  ostream *poVar1;
  char *pcVar2;
  
  if (flags == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
    pcVar2 = "NONE";
  }
  else {
    if ((flags & 1) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"FILE_ATTRIBUTE_READONLY");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,
                               "The file or directory is read-only. For a file, if this bit is set, "
                              );
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,
                               "applications can read the file but cannot write to it or delete it. "
                              );
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,
                               "For a directory, if this bit is set, applications cannot delete the directory."
                              );
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags & 2) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"FILE_ATTRIBUTE_HIDDEN");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"The file or directory is hidden. ");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,
                               "If this bit is set, the file or folder is not included in an ordinary directory listing."
                              );
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags & 4) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"ILE_ATTRIBUTE_SYSTEM");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,
                               "The file or directory is part of the operating system or is used exclusively by the operating system."
                              );
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags & 8) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"RESERVED1");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"A bit that MUST be zero.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags & 0x10) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"FILE_ATTRIBUTE_DIRECTORY");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"The link target is a directory instead of a file.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags & 0x20) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"FILE_ATTRIBUTE_ARCHIVE");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"The file or directory is an archive file. ");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,
                               "Applications use this flag to mark files for backup or removal.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags & 0x40) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"RESERVED2");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"A bit that MUST be zero.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((char)flags < '\0') {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"FILE_ATTRIBUTE_NORMAL");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"The file or directory has no other flags set. ");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,
                               "If this bit is 1, all other bits in this structure MUST be clear.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags >> 8 & 1) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1," FILE_ATTRIBUTE_TEMPORARY");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"The file is being used for temporary storage.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags >> 9 & 1) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"FILE_ATTRIBUTE_SPARSE_FILE");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"The file is a sparse file.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags >> 10 & 1) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"FILE_ATTRIBUTE_REPARSE_POINT");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"The file or directory has an associated reparse point.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags >> 0xb & 1) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"FILE_ATTRIBUTE_COMPRESSED");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,
                               "The file or directory is compressed. For a file, this means that all data in the file is compressed. "
                              );
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,
                               "For a directory, this means that compression is the default for newly created files and subdirectories."
                              );
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags >> 0xc & 1) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"FILE_ATTRIBUTE_OFFLINE");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"The data of the file is not immediately available.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags >> 0xd & 1) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"FILE_ATTRIBUTE_NOT_CONTENT_INDEXED");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar1 = std::operator<<(poVar1,"The contents of the file need to be indexed.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((flags >> 0xe & 1) == 0) {
      return;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"FILE_ATTRIBUTE_ENCRYPTED");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,
                             "The file or directory is encrypted. For a file, this means that all data in the file is encrypted. "
                            );
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    pcVar2 = 
    "For a directory, this means that encryption is the default for newly created files and subdirectories."
    ;
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ShellLinkHeader::parseFileAttributesFlags(unsigned int flags) {
        if (flags == 0x00000000)
            cout << Utils::defaultOffset << "NONE" << endl;
        if (flags & FILE_ATTRIBUTE_READONLY) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_READONLY" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is read-only. For a file, if this bit is set, " << endl <<
                 Utils::defaultOffsetDocInfo << "applications can read the file but cannot write to it or delete it. " << endl <<
                 Utils::defaultOffsetDocInfo << "For a directory, if this bit is set, applications cannot delete the directory." << endl;
        }
        if (flags & FILE_ATTRIBUTE_HIDDEN) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_HIDDEN" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is hidden. " << endl <<
                 Utils::defaultOffsetDocInfo << "If this bit is set, the file or folder is not included in an ordinary directory listing." << endl;
        }
        if (flags & FILE_ATTRIBUTE_SYSTEM) {
            cout << Utils::defaultOffset << "ILE_ATTRIBUTE_SYSTEM" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is part of the operating system or is used exclusively by the operating system." << endl;
        }
        if (flags & RESERVED1) {
            cout << Utils::defaultOffset << "RESERVED1" << endl <<
                 Utils::defaultOffsetDocInfo << "A bit that MUST be zero." << endl;
        }
        if (flags & FILE_ATTRIBUTE_DIRECTORY) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_DIRECTORY" << endl <<
                 Utils::defaultOffsetDocInfo << "The link target is a directory instead of a file." << endl;
        }
        if (flags & FILE_ATTRIBUTE_ARCHIVE) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_ARCHIVE" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is an archive file. " << endl <<
                 Utils::defaultOffsetDocInfo << "Applications use this flag to mark files for backup or removal." << endl;
        }
        if (flags & RESERVED2) {
            cout << Utils::defaultOffset << "RESERVED2" << endl <<
                 Utils::defaultOffsetDocInfo << "A bit that MUST be zero." << endl;
        }
        if (flags & FILE_ATTRIBUTE_NORMAL) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_NORMAL" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory has no other flags set. " << endl <<
                 Utils::defaultOffsetDocInfo << "If this bit is 1, all other bits in this structure MUST be clear." << endl;
        }
        if (flags & FILE_ATTRIBUTE_TEMPORARY) {
            cout << Utils::defaultOffset << " FILE_ATTRIBUTE_TEMPORARY" << endl <<
                 Utils::defaultOffsetDocInfo << "The file is being used for temporary storage." << endl;
        }
        if (flags & FILE_ATTRIBUTE_SPARSE_FILE) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_SPARSE_FILE" << endl <<
                 Utils::defaultOffsetDocInfo << "The file is a sparse file." << endl;
        }
        if (flags & FILE_ATTRIBUTE_REPARSE_POINT) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_REPARSE_POINT" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory has an associated reparse point." << endl;
        }
        if (flags & FILE_ATTRIBUTE_COMPRESSED) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_COMPRESSED" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is compressed. For a file, this means that all data in the file is compressed. " << endl <<
                 Utils::defaultOffsetDocInfo << "For a directory, this means that compression is the default for newly created files and subdirectories." << endl;
        }
        if (flags & FILE_ATTRIBUTE_OFFLINE) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_OFFLINE" << endl <<
                 Utils::defaultOffsetDocInfo << "The data of the file is not immediately available." << endl;
        }
        if (flags & FILE_ATTRIBUTE_NOT_CONTENT_INDEXED) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_NOT_CONTENT_INDEXED" << endl <<
                 Utils::defaultOffsetDocInfo << "The contents of the file need to be indexed." << endl;
        }
        if (flags & FILE_ATTRIBUTE_ENCRYPTED) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_ENCRYPTED" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is encrypted. For a file, this means that all data in the file is encrypted. " << endl <<
                 Utils::defaultOffsetDocInfo << "For a directory, this means that encryption is the default for newly created files and subdirectories." << endl;
        }
    }